

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O2

char * strip_function_from(char *token,char *function_name)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  _Var1 = begins_with(token,function_name);
  if (_Var1) {
    sVar2 = strlen(function_name);
    if (token[sVar2] == '(') {
      sVar3 = strlen(token);
      if (token[sVar3 - 1] == ')') {
        sVar3 = strlen(token);
        sVar4 = strlen(function_name);
        memmove(token,token + sVar4 + 1,(long)(((int)sVar3 - (int)sVar2) + -2) + 2);
        sVar2 = strlen(token);
        token[sVar2 - 1] = '\0';
      }
    }
  }
  return token;
}

Assistant:

static char *strip_function_from(char *token, const char *function_name) {
    if (begins_with(token, function_name) && token[strlen(function_name)] == '(' && last_char_of(token) == ')') {
        int parameter_length = strlen(token) - strlen(function_name) - strlen("()");
        move_parameter_to_beginning_of(token, function_name, parameter_length);
    }

    return token;
}